

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Base64.cpp
# Opt level: O0

string * TUPU::base64_encode_abi_cxx11_(void *input,size_t input_len)

{
  size_t sVar1;
  char *pcVar2;
  BIO_METHOD *pBVar3;
  long lVar4;
  int in_EDX;
  void *in_RSI;
  string *in_RDI;
  char *buffer;
  BUF_MEM *bptr;
  BIO *b64;
  BIO *bmem;
  string *result;
  allocator local_52;
  undefined1 local_51;
  char *local_50;
  allocator local_31;
  size_t *local_30;
  BIO *local_28;
  BIO *local_20;
  int local_18;
  void *local_10;
  
  local_30 = (size_t *)0x0;
  local_10 = in_RSI;
  local_18 = in_EDX;
  pBVar3 = BIO_f_base64();
  local_28 = BIO_new(pBVar3);
  pBVar3 = BIO_s_mem();
  local_20 = BIO_new(pBVar3);
  local_28 = BIO_push(local_28,local_20);
  BIO_set_flags(local_28,0x100);
  BIO_write(local_28,local_10,local_18);
  lVar4 = BIO_ctrl(local_28,0xb,0,(void *)0x0);
  if ((int)lVar4 == 1) {
    BIO_ctrl(local_28,0x73,0,&local_30);
    local_50 = (char *)malloc(*local_30 + 1);
    memcpy(local_50,(void *)local_30[1],*local_30);
    pcVar2 = local_50;
    local_50[*local_30] = '\0';
    local_51 = 0;
    sVar1 = *local_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,pcVar2,sVar1 + 1,&local_52);
    std::allocator<char>::~allocator((allocator<char> *)&local_52);
    free(local_50);
    BIO_free_all(local_28);
  }
  else {
    BIO_free_all(local_28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"",&local_31);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  return in_RDI;
}

Assistant:

string TUPU::base64_encode(const void * input, size_t input_len)
{
    BIO *bmem, *b64;
    BUF_MEM * bptr = NULL;

    b64 = BIO_new(BIO_f_base64());
    bmem = BIO_new(BIO_s_mem());
    b64 = BIO_push(b64, bmem);

    //Ignore newlines - write everything in one line
    BIO_set_flags(b64, BIO_FLAGS_BASE64_NO_NL);

    BIO_write(b64, input, input_len);
    if (BIO_flush(b64) != 1) {
        BIO_free_all(b64);
        return "";
    }
    BIO_get_mem_ptr(b64, &bptr);

    char * buffer = (char *)malloc(bptr->length + 1);
    memcpy(buffer, bptr->data, bptr->length);
    buffer[bptr->length] = 0;
    string result(buffer, bptr->length + 1);
    free(buffer);

    //BIO_set_close(b64, BIO_NOCLOSE);
    BIO_free_all(b64);

    return result;
}